

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int set_sort(lyxp_set *set)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  lyd_node_inner *plVar3;
  lyd_node_inner *plVar4;
  lyxp_set_node *plVar5;
  lyxp_set_node *plVar6;
  lyxp_set_scnode *plVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  LY_ERR LVar11;
  int iVar12;
  uint32_t uVar13;
  lyd_node_inner *plVar14;
  lyd_node *root;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  lyxp_set_hash_node hnode;
  lyxp_set_node item;
  undefined8 local_58;
  undefined4 local_50 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar12 = 0;
  if ((set->type == LYXP_SET_NODE_SET) && (iVar12 = 0, 1 < set->used)) {
    plVar3 = (lyd_node_inner *)set->tree;
    plVar4 = (plVar3->field_0).node.parent;
    plVar14 = plVar3;
    while (plVar4 != (lyd_node_inner *)0x0) {
      plVar14 = plVar4;
      if (plVar3 == (lyd_node_inner *)0x0) {
        plVar14 = plVar3;
      }
      plVar4 = *(lyd_node_inner **)((long)&plVar14->field_0 + 0x10);
    }
    do {
      root = (lyd_node *)plVar14;
      plVar14 = (lyd_node_inner *)root->prev;
    } while (((lyd_node *)plVar14)->next != (lyd_node *)0x0);
    LVar11 = set_assign_pos(set,root,set->root_type);
    iVar12 = -1;
    if (LVar11 == LY_SUCCESS) {
      uVar15 = 0;
      ly_log_dbg(2,"SORT BEGIN");
      print_set_debug(set);
      if (set->used != 0) {
        uVar15 = 0;
        do {
          bVar10 = true;
          if (1 < set->used - uVar15) {
            uVar16 = 1;
            lVar17 = 0;
            bVar10 = false;
            bVar9 = false;
            do {
              if (bVar9) {
                plVar5 = (set->val).nodes;
                plVar6 = plVar5 + 1;
              }
              else {
                plVar6 = (set->val).nodes;
                plVar5 = plVar6 + 1;
              }
              iVar12 = set_sort_compare((lyxp_set_node *)((long)&plVar6->node + lVar17),
                                        (lyxp_set_node *)((long)&plVar5->node + lVar17));
              if ((bVar9 && iVar12 < 0) || (!bVar9 && 0 < iVar12)) {
                plVar7 = (set->val).scnodes;
                puVar1 = (undefined8 *)((long)&plVar7->scnode + lVar17);
                local_48 = *puVar1;
                uStack_40 = puVar1[1];
                puVar2 = (undefined8 *)((long)&plVar7->axis + lVar17);
                uVar8 = puVar2[1];
                puVar1 = (undefined8 *)((long)&plVar7->scnode + lVar17);
                *puVar1 = *puVar2;
                puVar1[1] = uVar8;
                puVar1 = (undefined8 *)((long)&((set->val).scnodes)->axis + lVar17);
                *puVar1 = local_48;
                puVar1[1] = uStack_40;
                bVar10 = true;
              }
              else {
                bVar9 = !bVar9;
              }
              uVar16 = uVar16 + 1;
              lVar17 = lVar17 + 0x10;
            } while (uVar16 < set->used - uVar15);
            bVar10 = !bVar10;
          }
          uVar15 = uVar15 + 1;
        } while ((!bVar10) && (uVar15 < set->used));
      }
      ly_log_dbg(2,"SORT END %d",(ulong)uVar15);
      print_set_debug(set);
      if (3 < set->used) {
        if (set->ht == (ly_ht *)0x0) {
          __assert_fail("set->ht",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x720,"int set_sort(struct lyxp_set *)");
        }
        if (set->used != 0) {
          lVar17 = 8;
          uVar16 = 0;
          do {
            local_58 = *(undefined8 *)((long)(set->val).nodes + lVar17 + -8);
            local_50[0] = *(undefined4 *)((long)&((set->val).nodes)->node + lVar17);
            uVar13 = lyht_hash_multi(0,(char *)&local_58,8);
            uVar13 = lyht_hash_multi(uVar13,(char *)local_50,4);
            uVar13 = lyht_hash_multi(uVar13,(char *)0x0,0);
            LVar11 = lyht_find(set->ht,&local_58,uVar13,(void **)0x0);
            if (LVar11 != LY_SUCCESS) {
              __assert_fail("!lyht_find(set->ht, &hnode, hash, NULL)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0x729,"int set_sort(struct lyxp_set *)");
            }
            uVar16 = uVar16 + 1;
            lVar17 = lVar17 + 0x10;
          } while (uVar16 < set->used);
        }
      }
      iVar12 = uVar15 - 1;
    }
  }
  return iVar12;
}

Assistant:

static int
set_sort(struct lyxp_set *set)
{
    uint32_t i, j;
    int ret = 0, cmp;
    ly_bool inverted, change;
    const struct lyd_node *root;
    struct lyxp_set_node item;
    struct lyxp_set_hash_node hnode;
    uint64_t hash;

    if ((set->type != LYXP_SET_NODE_SET) || (set->used < 2)) {
        return 0;
    }

    /* find first top-level node to be used as anchor for positions */
    for (root = set->tree; root->parent; root = lyd_parent(root)) {}
    for ( ; root->prev->next; root = root->prev) {}

    /* fill positions */
    if (set_assign_pos(set, root, set->root_type)) {
        return -1;
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "SORT BEGIN");
    print_set_debug(set);
#endif

    for (i = 0; i < set->used; ++i) {
        inverted = 0;
        change = 0;

        for (j = 1; j < set->used - i; ++j) {
            /* compare node positions */
            if (inverted) {
                cmp = set_sort_compare(&set->val.nodes[j], &set->val.nodes[j - 1]);
            } else {
                cmp = set_sort_compare(&set->val.nodes[j - 1], &set->val.nodes[j]);
            }

            /* swap if needed */
            if ((inverted && (cmp < 0)) || (!inverted && (cmp > 0))) {
                change = 1;

                item = set->val.nodes[j - 1];
                set->val.nodes[j - 1] = set->val.nodes[j];
                set->val.nodes[j] = item;
            } else {
                /* whether node_pos1 should be smaller than node_pos2 or the other way around */
                inverted = !inverted;
            }
        }

        ++ret;

        if (!change) {
            break;
        }
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "SORT END %d", ret);
    print_set_debug(set);
#endif

    /* check node hashes */
    if (set->used >= LYD_HT_MIN_ITEMS) {
        assert(set->ht);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = lyht_hash_multi(hash, NULL, 0);

            assert(!lyht_find(set->ht, &hnode, hash, NULL));
        }
    }

    return ret - 1;
}